

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_cmp_16_ai(void)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar2 = OPER_AY_AI_16();
  uVar1 = *(ushort *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c));
  uVar3 = uVar1 - uVar2;
  m68ki_cpu.n_flag = uVar3 >> 8;
  m68ki_cpu.not_z_flag = uVar3 & 0xffff;
  m68ki_cpu.v_flag = ((uVar3 ^ uVar1) & (uVar2 ^ uVar1)) >> 8;
  m68ki_cpu.c_flag = uVar3 >> 8;
  return;
}

Assistant:

static void m68k_op_cmp_16_ai(void)
{
	uint src = OPER_AY_AI_16();
	uint dst = MASK_OUT_ABOVE_16(DX);
	uint res = dst - src;

	FLAG_N = NFLAG_16(res);
	FLAG_Z = MASK_OUT_ABOVE_16(res);
	FLAG_V = VFLAG_SUB_16(src, dst, res);
	FLAG_C = CFLAG_16(res);
}